

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O0

float NULLCMath::normalize3(float4 *v)

{
  float fVar1;
  float fVar2;
  float invLen;
  float len;
  float4 *v_local;
  
  fVar1 = length3(v);
  fVar2 = 1.0 / fVar1;
  v->x = fVar2 * v->x;
  v->y = fVar2 * v->y;
  v->z = fVar2 * v->z;
  return fVar1;
}

Assistant:

float normalize3(float4* v)
	{
		float len = length3(v), invLen = 1.0f / len;
		v->x *= invLen;
		v->y *= invLen;
		v->z *= invLen;
		return len;
	}